

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_adaptive_eval_simd.h
# Opt level: O2

void __thiscall
embree::avx::
FeatureAdaptiveEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
::FeatureAdaptiveEvalSimd
          (FeatureAdaptiveEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
           *this,CatmullClarkPatch *patch,vboolf_impl<4> *valid,vfloat_impl<4> *u,vfloat_impl<4> *v,
          float dscale,size_t depth,float *P,float *dPdu,float *dPdv,float *ddPdudu,float *ddPdvdv,
          float *ddPdudv,size_t dstride,size_t N)

{
  anon_union_32_2_4062524c_for_Vec2<embree::vfloat_impl<4>_>_1 local_28;
  
  this->P = P;
  this->dPdu = dPdu;
  this->dPdv = dPdv;
  this->ddPdudu = ddPdudu;
  this->ddPdvdv = ddPdvdv;
  this->ddPdudv = ddPdudv;
  this->dstride = dstride;
  this->N = N;
  local_28._0_8_ = *(undefined8 *)&u->field_0;
  local_28._8_8_ = *(undefined8 *)((long)&u->field_0 + 8);
  local_28._16_8_ = *(undefined8 *)&v->field_0;
  local_28._24_8_ = *(undefined8 *)((long)&v->field_0 + 8);
  eval_direct(this,valid,patch,(Vec2<embree::vfloat_impl<4>_> *)&local_28.field_0,dscale,depth,
              (BezierCurve *)0x0,(BezierCurve *)0x0,SUB168(ZEXT816(0),4),(BezierCurve *)0x0);
  return;
}

Assistant:

FeatureAdaptiveEvalSimd (const CatmullClarkPatch& patch, const vbool& valid, const vfloat& u, const vfloat& v, float dscale, size_t depth, 
                                 float* P, float* dPdu, float* dPdv, float* ddPdudu, float* ddPdvdv, float* ddPdudv, const size_t dstride, const size_t N)
        : P(P), dPdu(dPdu), dPdv(dPdv), ddPdudu(ddPdudu), ddPdvdv(ddPdvdv), ddPdudv(ddPdudv), dstride(dstride), N(N)
        {
          eval_direct(valid,patch,Vec2<vfloat>(u,v),dscale,depth);
        }